

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.h
# Opt level: O1

void __thiscall Highs::~Highs(Highs *this)

{
  ~Highs(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Highs() {
    FILE* log_stream = options_.log_options.log_stream;
    if (log_stream != nullptr) {
      assert(log_stream != stdout);
      fclose(log_stream);
    }
  }